

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode expect100(Curl_easy *data,connectdata *conn,Curl_send_buffer *req_buffer)

{
  int iVar1;
  long lVar2;
  _Bool _Var3;
  CURLcode CVar4;
  char *headerline;
  
  (data->state).expect100header = false;
  if (((((data->state).httpversion != 10) && (iVar1 = conn->httpversion, iVar1 != 10)) &&
      (lVar2 = (data->set).httpversion, 10 < iVar1 || lVar2 != 1)) &&
     (iVar1 != 0x14 && (1 < lVar2 || lVar2 == 0))) {
    headerline = Curl_checkheaders(conn,"Expect:");
    if (headerline == (char *)0x0) {
      CVar4 = Curl_add_bufferf(req_buffer,"Expect: 100-continue\r\n");
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      _Var3 = true;
    }
    else {
      _Var3 = Curl_compareheader(headerline,"Expect:","100-continue");
    }
    (data->state).expect100header = _Var3;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode expect100(struct Curl_easy *data,
                          struct connectdata *conn,
                          Curl_send_buffer *req_buffer)
{
  CURLcode result = CURLE_OK;
  const char *ptr;
  data->state.expect100header = FALSE; /* default to false unless it is set
                                          to TRUE below */
  if(use_http_1_1plus(data, conn) &&
     (conn->httpversion != 20)) {
    /* if not doing HTTP 1.0 or version 2, or disabled explicitly, we add an
       Expect: 100-continue to the headers which actually speeds up post
       operations (as there is one packet coming back from the web server) */
    ptr = Curl_checkheaders(conn, "Expect:");
    if(ptr) {
      data->state.expect100header =
        Curl_compareheader(ptr, "Expect:", "100-continue");
    }
    else {
      result = Curl_add_bufferf(req_buffer,
                         "Expect: 100-continue\r\n");
      if(!result)
        data->state.expect100header = TRUE;
    }
  }

  return result;
}